

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
::find_or_prepare_insert_non_soo<char[5]>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
          *this,char (*key) [5])

{
  ctrl_t *pcVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  ushort uVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  bool bVar39;
  char cVar40;
  ushort uVar41;
  uint uVar42;
  size_t size;
  MixingHashState MVar43;
  ctrl_t *pcVar44;
  ulong uVar45;
  ulong uVar46;
  uint64_t v;
  ulong uVar47;
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i match;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  FindInfo FVar53;
  ulong local_b8;
  char (*local_78) [5];
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
  *local_70;
  _Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_68;
  _Head_base<0UL,_const_google::protobuf::FieldDescriptorProto_Type_&,_false> local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  size = strlen(*key);
  MVar43 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,(uchar *)key,size);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = MVar43.state_ + size;
  uVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar45 = SUB168(auVar49 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar49 * ZEXT816(0x9ddfea08eb382d69),0);
  pcVar44 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.control;
  uVar47 = uVar45 >> 7 ^ (ulong)pcVar44 >> 0xc;
  auVar49 = ZEXT216(CONCAT11((char)uVar45,(char)uVar45) & 0x7f7f);
  auVar49 = pshuflw(auVar49,auVar49,0);
  uVar48 = auVar49._0_4_;
  auVar51._4_4_ = uVar48;
  auVar51._0_4_ = uVar48;
  auVar51._8_4_ = uVar48;
  auVar51._12_4_ = uVar48;
  local_b8 = 0;
  do {
    uVar47 = uVar47 & uVar2;
    pcVar1 = pcVar44 + uVar47;
    auVar50[0] = -(auVar51[0] == *pcVar1);
    auVar50[1] = -(auVar51[1] == pcVar1[1]);
    auVar50[2] = -(auVar51[2] == pcVar1[2]);
    auVar50[3] = -(auVar51[3] == pcVar1[3]);
    auVar50[4] = -(auVar51[4] == pcVar1[4]);
    auVar50[5] = -(auVar51[5] == pcVar1[5]);
    auVar50[6] = -(auVar51[6] == pcVar1[6]);
    auVar50[7] = -(auVar51[7] == pcVar1[7]);
    auVar50[8] = -(auVar51[8] == pcVar1[8]);
    auVar50[9] = -(auVar51[9] == pcVar1[9]);
    auVar50[10] = -(auVar51[10] == pcVar1[10]);
    auVar50[0xb] = -(auVar51[0xb] == pcVar1[0xb]);
    auVar50[0xc] = -(auVar51[0xc] == pcVar1[0xc]);
    auVar50[0xd] = -(auVar51[0xd] == pcVar1[0xd]);
    auVar50[0xe] = -(auVar51[0xe] == pcVar1[0xe]);
    auVar50[0xf] = -(auVar51[0xf] == pcVar1[0xf]);
    uVar41 = (ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe | (ushort)(auVar50[0xf] >> 7) << 0xf;
    uVar42 = (uint)uVar41;
    cVar23 = *pcVar1;
    cVar24 = pcVar1[1];
    cVar25 = pcVar1[2];
    cVar26 = pcVar1[3];
    cVar27 = pcVar1[4];
    cVar28 = pcVar1[5];
    cVar29 = pcVar1[6];
    cVar30 = pcVar1[7];
    cVar31 = pcVar1[8];
    cVar32 = pcVar1[9];
    cVar33 = pcVar1[10];
    cVar34 = pcVar1[0xb];
    cVar35 = pcVar1[0xc];
    cVar36 = pcVar1[0xd];
    cVar37 = pcVar1[0xe];
    cVar38 = pcVar1[0xf];
    cVar7 = local_58;
    cVar8 = cStack_57;
    cVar9 = cStack_56;
    cVar10 = cStack_55;
    cVar11 = cStack_54;
    cVar12 = cStack_53;
    cVar13 = cStack_52;
    cVar14 = cStack_51;
    cVar15 = cStack_50;
    cVar16 = cStack_4f;
    cVar17 = cStack_4e;
    cVar18 = cStack_4d;
    cVar19 = cStack_4c;
    cVar20 = cStack_4b;
    cVar21 = cStack_4a;
    cVar22 = cStack_49;
    while (cStack_49 = cVar38, cStack_4a = cVar37, cStack_4b = cVar36, cStack_4c = cVar35,
          cStack_4d = cVar34, cStack_4e = cVar33, cStack_4f = cVar32, cStack_50 = cVar31,
          cStack_51 = cVar30, cStack_52 = cVar29, cStack_53 = cVar28, cStack_54 = cVar27,
          cStack_55 = cVar26, cStack_56 = cVar25, cStack_57 = cVar24, local_58 = cVar23, uVar41 != 0
          ) {
      uVar5 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      lVar3 = *(long *)((long)&(this->settings_).
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      uVar46 = uVar5 + uVar47 & uVar2;
      local_68._M_head_impl =
           (basic_string_view<char,_std::char_traits<char>_> *)(lVar3 + uVar46 * 0x18);
      local_60._M_head_impl = (FieldDescriptorProto_Type *)(lVar3 + 0x10 + uVar46 * 0x18);
      local_78 = key;
      local_70 = this;
      local_48 = auVar51;
      bVar39 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
               ::EqualElement<char[5]>::operator()
                         ((EqualElement<char[5]> *)&local_78,local_68._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
                          &local_68,
                          (tuple<const_google::protobuf::FieldDescriptorProto_Type_&> *)&local_60);
      if (bVar39) {
        pcVar44 = (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (pcVar44 == (ctrl_t *)0x0) goto LAB_001dadde;
        pcVar44 = pcVar44 + uVar46;
        bVar39 = false;
        goto LAB_001dad89;
      }
      uVar41 = (ushort)(uVar42 - 1) & (ushort)uVar42;
      uVar42 = CONCAT22((short)(uVar42 - 1 >> 0x10),uVar41);
      auVar51 = local_48;
      cVar23 = local_58;
      cVar24 = cStack_57;
      cVar25 = cStack_56;
      cVar26 = cStack_55;
      cVar27 = cStack_54;
      cVar28 = cStack_53;
      cVar29 = cStack_52;
      cVar30 = cStack_51;
      cVar31 = cStack_50;
      cVar32 = cStack_4f;
      cVar33 = cStack_4e;
      cVar34 = cStack_4d;
      cVar35 = cStack_4c;
      cVar36 = cStack_4b;
      cVar37 = cStack_4a;
      cVar38 = cStack_49;
      cVar7 = local_58;
      cVar8 = cStack_57;
      cVar9 = cStack_56;
      cVar10 = cStack_55;
      cVar11 = cStack_54;
      cVar12 = cStack_53;
      cVar13 = cStack_52;
      cVar14 = cStack_51;
      cVar15 = cStack_50;
      cVar16 = cStack_4f;
      cVar17 = cStack_4e;
      cVar18 = cStack_4d;
      cVar19 = cStack_4c;
      cVar20 = cStack_4b;
      cVar21 = cStack_4a;
      cVar22 = cStack_49;
    }
    auVar52[0] = -(local_58 == kEmpty);
    auVar52[1] = -(cStack_57 == kEmpty);
    auVar52[2] = -(cStack_56 == kEmpty);
    auVar52[3] = -(cStack_55 == kEmpty);
    auVar52[4] = -(cStack_54 == kEmpty);
    auVar52[5] = -(cStack_53 == kEmpty);
    auVar52[6] = -(cStack_52 == kEmpty);
    auVar52[7] = -(cStack_51 == kEmpty);
    auVar52[8] = -(cStack_50 == kEmpty);
    auVar52[9] = -(cStack_4f == kEmpty);
    auVar52[10] = -(cStack_4e == kEmpty);
    auVar52[0xb] = -(cStack_4d == kEmpty);
    auVar52[0xc] = -(cStack_4c == kEmpty);
    auVar52[0xd] = -(cStack_4b == kEmpty);
    auVar52[0xe] = -(cStack_4a == kEmpty);
    auVar52[0xf] = -(cStack_49 == kEmpty);
    uVar41 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    local_58 = cVar7;
    cStack_57 = cVar8;
    cStack_56 = cVar9;
    cStack_55 = cVar10;
    cStack_54 = cVar11;
    cStack_53 = cVar12;
    cStack_52 = cVar13;
    cStack_51 = cVar14;
    cStack_50 = cVar15;
    cStack_4f = cVar16;
    cStack_4e = cVar17;
    cStack_4d = cVar18;
    cStack_4c = cVar19;
    cStack_4b = cVar20;
    cStack_4a = cVar21;
    cStack_49 = cVar22;
    if (uVar41 != 0) {
      cVar40 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         ((this->settings_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,uVar45,
                          (this->settings_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (cVar40 == '\0') {
        uVar42 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar41 != 0) {
          for (; uVar41 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar42 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar53.offset = uVar42 + uVar47 & uVar2;
      FVar53.probe_length = local_b8;
      uVar46 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar45,FVar53,
                          (PolicyFunctions *)
                          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                          ::GetPolicyFunctions()::value);
      pcVar44 = (this->settings_).
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.control;
      if (pcVar44 == (ctrl_t *)0x0) {
LAB_001dadde:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>]"
                     );
      }
      pcVar44 = pcVar44 + uVar46;
      bVar39 = true;
LAB_001dad89:
      pvVar4 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.slot_array.p;
      (__return_storage_ptr__->first).ctrl_ = pcVar44;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar46 * 0x18 + (long)pvVar4);
      __return_storage_ptr__->second = bVar39;
      return __return_storage_ptr__;
    }
    uVar47 = uVar47 + local_b8 + 0x10;
    local_b8 = local_b8 + 0x10;
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < local_b8) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>, K = char[5]]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }